

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service_base::
start_op<asio::detail::reactive_socket_recv_op<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,int op_type,
          reactive_socket_recv_op<asio::mutable_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
          *op,bool is_continuation,bool allow_speculative,bool noop,bool needs_non_blocking,
          void *param_8,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::handler_type,_typename_reactive_socket_recv_op<mutable_buffers_1,_function<void_(const_error_code_&,_unsigned_long)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_9)

{
  uint32_t *puVar1;
  atomic_count *paVar2;
  uint uVar3;
  reactor *prVar4;
  per_descriptor_data pdVar5;
  reactor *prVar6;
  per_descriptor_data pdVar7;
  reactor_op *prVar8;
  bool bVar9;
  status sVar10;
  int iVar11;
  reactor_op **pprVar12;
  int *piVar13;
  error_category *peVar14;
  reactor_op *prVar15;
  epoll_event ev;
  epoll_event local_40;
  
  prVar4 = this->reactor_;
  if ((noop) ||
     ((needs_non_blocking && (impl->state_ & 3) == 0 &&
      (bVar9 = socket_ops::set_internal_non_blocking
                         (impl->socket_,&impl->state_,true,
                          &(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).
                           super_reactor_op.ec_), !bVar9)))) {
LAB_003c65ff:
    scheduler::post_immediate_completion(prVar4->scheduler_,(operation *)op,is_continuation);
    return;
  }
  pdVar5 = impl->reactor_data_;
  if (pdVar5 == (per_descriptor_data)0x0) {
    std::error_code::operator=
              (&(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
                ec_,bad_descriptor);
    goto LAB_003c65ff;
  }
  prVar6 = this->reactor_;
  iVar11 = impl->socket_;
  bVar9 = (pdVar5->mutex_).enabled_ == true;
  if (bVar9) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar5->mutex_).mutex_);
  }
  pdVar7 = impl->reactor_data_;
  if (pdVar7->shutdown_ == false) {
    if (pdVar7->op_queue_[op_type].front_ == (reactor_op *)0x0) {
      if ((allow_speculative) &&
         ((op_type != 0 || (pdVar7->op_queue_[2].front_ == (reactor_op *)0x0)))) {
        if ((pdVar7->try_speculative_[op_type] == true) &&
           (sVar10 = (*(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).
                       super_reactor_op.perform_func_)((reactor_op *)op), sVar10 != not_done)) {
          if ((sVar10 == done_and_exhausted) && (impl->reactor_data_->registered_events_ != 0)) {
            impl->reactor_data_->try_speculative_[op_type] = false;
          }
          if (bVar9) {
            if ((pdVar5->mutex_).enabled_ == true) {
              pthread_mutex_unlock((pthread_mutex_t *)&(pdVar5->mutex_).mutex_);
            }
            bVar9 = false;
          }
          scheduler::post_immediate_completion(prVar4->scheduler_,(operation *)op,is_continuation);
          goto LAB_003c669c;
        }
        pdVar7 = impl->reactor_data_;
        uVar3 = pdVar7->registered_events_;
        if (uVar3 == 0) goto LAB_003c681c;
        if ((op_type == 1) && ((uVar3 & 4) == 0)) {
          local_40.events = uVar3 | 4;
          local_40._4_4_ = SUB84(pdVar7,0);
          local_40.data.fd = (int)((ulong)pdVar7 >> 0x20);
          iVar11 = epoll_ctl(prVar6->epoll_fd_,3,iVar11,&local_40);
          if (iVar11 != 0) {
            piVar13 = __errno_location();
            iVar11 = *piVar13;
            peVar14 = error::get_system_category();
            (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
            _M_value = iVar11;
            (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
            _M_cat = peVar14;
            scheduler::post_immediate_completion(prVar4->scheduler_,(operation *)op,is_continuation)
            ;
            goto LAB_003c669c;
          }
          puVar1 = &impl->reactor_data_->registered_events_;
          *puVar1 = *puVar1 | local_40.events;
        }
      }
      else {
        if (pdVar7->registered_events_ == 0) {
LAB_003c681c:
          std::error_code::operator=
                    (&(op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).
                      super_reactor_op.ec_,operation_not_supported);
          goto LAB_003c6633;
        }
        if (op_type == 1) {
          pdVar7->registered_events_ = pdVar7->registered_events_ | 4;
        }
        local_40.events = pdVar7->registered_events_;
        local_40._4_4_ = SUB84(pdVar7,0);
        local_40.data.fd = (int)((ulong)pdVar7 >> 0x20);
        epoll_ctl(prVar6->epoll_fd_,3,iVar11,&local_40);
      }
    }
    pdVar7 = impl->reactor_data_;
    (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
    super_operation.next_ = (scheduler_operation *)0x0;
    pprVar12 = &pdVar7->op_queue_[op_type].back_;
    prVar8 = *pprVar12;
    prVar15 = prVar8;
    if (prVar8 == (reactor_op *)0x0) {
      prVar15 = (reactor_op *)pprVar12;
    }
    (prVar15->super_operation).next_ = (scheduler_operation *)op;
    (&pdVar7->op_queue_[op_type].front_)[prVar8 != (reactor_op *)0x0] = (reactor_op *)op;
    LOCK();
    paVar2 = &prVar6->scheduler_->outstanding_work_;
    (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  else {
LAB_003c6633:
    scheduler::post_immediate_completion(prVar4->scheduler_,(operation *)op,is_continuation);
  }
LAB_003c669c:
  if (bVar9) {
    pthread_mutex_unlock((pthread_mutex_t *)&(pdVar5->mutex_).mutex_);
  }
  return;
}

Assistant:

void start_op(base_implementation_type& impl, int op_type,
      Op* op, bool is_continuation, bool allow_speculative,
      bool noop, bool needs_non_blocking, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_op(impl, op_type, op, is_continuation,
        allow_speculative, noop, needs_non_blocking,
        &reactor::call_post_immediate_completion, &reactor_);
  }